

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

char * __thiscall
icu_63::UnicodeKeywordEnumeration::next
          (UnicodeKeywordEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  char *pcVar1;
  size_t sVar2;
  int32_t iVar3;
  
  iVar3 = 0;
  pcVar1 = icu_63::KeywordEnumeration::next(&this->super_KeywordEnumeration,(int32_t *)0x0,status);
  if ((pcVar1 != (char *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    pcVar1 = uloc_toUnicodeLocaleKey_63(pcVar1);
    if (pcVar1 != (char *)0x0) {
      if (resultLength == (int32_t *)0x0) {
        return pcVar1;
      }
      sVar2 = strlen(pcVar1);
      iVar3 = (int32_t)sVar2;
      goto LAB_00174a21;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  pcVar1 = (char *)0x0;
  if (resultLength == (int32_t *)0x0) {
    return (char *)0x0;
  }
LAB_00174a21:
  *resultLength = iVar3;
  return pcVar1;
}

Assistant:

virtual const char* next(int32_t* resultLength, UErrorCode& status) {
        const char* legacy_key = KeywordEnumeration::next(nullptr, status);
        if (U_SUCCESS(status) && legacy_key != nullptr) {
            const char* key = uloc_toUnicodeLocaleKey(legacy_key);
            if (key == nullptr) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
            } else {
                if (resultLength != nullptr) {
                    *resultLength = static_cast<int32_t>(uprv_strlen(key));
                }
                return key;
            }
        }
        if (resultLength != nullptr) *resultLength = 0;
        return nullptr;
    }